

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall DL::Lexer::next(Token *__return_storage_ptr__,Lexer *this)

{
  Lexer *this_local;
  Token *token;
  
  if ((this->mNextToken).Type == T_EOF) {
    getNextToken(__return_storage_ptr__,this);
  }
  else {
    Token::Token(__return_storage_ptr__,&this->mNextToken);
    this->mColumnNumber = this->mNextColumnNumber;
    this->mLineNumber = this->mNextLineNumber;
    (this->mNextToken).Type = T_EOF;
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::next()
{
	// Restore from look()
	if (mNextToken.Type != T_EOF) {
		Token token		= mNextToken;
		mColumnNumber   = mNextColumnNumber;
		mLineNumber		= mNextLineNumber;
		mNextToken.Type = T_EOF;
		return token;
	} else {
		return getNextToken();
	}
}